

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 06.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_18;
  char acStack_14 [3];
  char n;
  int i;
  char eme [8];
  
  eme[0] = '\0';
  eme[1] = '\0';
  eme[2] = '\0';
  eme[3] = '\0';
  setlocale(6,anon_var_dwarf_6ee + 0x43);
  _acStack_14 = 0x6d34333b315b1b;
  std::operator<<((ostream *)&std::cout,acStack_14);
  for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Friedrich Nietzsche");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6c2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6d8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ee);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Ate entao temos um \'tu deves\'.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Precisamos de uma moral que nos entregue um \'tu sentes?\'");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
  setlocale(LC_ALL, "");

  char eme[] = {0x1b, '[', '1', ';', '3', '4', 'm', 0};
  cout << eme;

  int i = 6;
  const char n = 'n';

  for (i = 0; i <= 6; i++)
  {
    if (n)
    {
      cout << i << endl;
    }
    cout << "Friedrich Nietzsche" << endl;
    cout << "O medo é o pai da moralidade." << endl;
    cout << "Aquele que abandonou a Deus prende-se em redobrada severidade à crença na moral." << endl;
    cout << "Através da moral conduz-se a humanidade mais facilmente pelo bico!" << endl;
  }
  cout << "Ate entao temos um 'tu deves'." << endl;
  cout << "Precisamos de uma moral que nos entregue um 'tu sentes?'" << endl;
  cout << endl;

  return 0;
}